

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction.cc
# Opt level: O1

void __thiscall
sptk::AperiodicityExtraction::AperiodicityExtraction
          (AperiodicityExtraction *this,int fft_length,int frame_shift,double sampling_rate,
          Algorithms algorithm)

{
  AperiodicityExtractionByTandem *this_00;
  
  this->_vptr_AperiodicityExtraction = (_func_int **)&PTR__AperiodicityExtraction_0011ec18;
  if (algorithm == kWorld) {
    this_00 = (AperiodicityExtractionByTandem *)operator_new(0x20);
    AperiodicityExtractionByWorld::AperiodicityExtractionByWorld
              ((AperiodicityExtractionByWorld *)this_00,fft_length,frame_shift,sampling_rate);
  }
  else if (algorithm == kTandem) {
    this_00 = (AperiodicityExtractionByTandem *)operator_new(0x20);
    AperiodicityExtractionByTandem::AperiodicityExtractionByTandem
              (this_00,fft_length,frame_shift,sampling_rate);
  }
  else {
    this_00 = (AperiodicityExtractionByTandem *)0x0;
  }
  this->aperiodicity_extraction_ = &this_00->super_AperiodicityExtractionInterface;
  return;
}

Assistant:

AperiodicityExtraction::AperiodicityExtraction(
    int fft_length, int frame_shift, double sampling_rate,
    AperiodicityExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kTandem: {
      aperiodicity_extraction_ = new AperiodicityExtractionByTandem(
          fft_length, frame_shift, sampling_rate);
      break;
    }
    case kWorld: {
      aperiodicity_extraction_ = new AperiodicityExtractionByWorld(
          fft_length, frame_shift, sampling_rate);
      break;
    }
    default: {
      aperiodicity_extraction_ = NULL;
      break;
    }
  }
}